

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O1

Instr * Peeps::PeepBranch(BranchInstr *branchInstr,bool *peepedRef)

{
  IRKind IVar1;
  char cVar2;
  OpCode OVar3;
  Kind KVar4;
  Type pAVar5;
  Func *pFVar6;
  long *plVar7;
  code *pcVar8;
  bool bVar9;
  OpndKind OVar10;
  byte bVar11;
  OpCode opcode;
  LabelInstr *pLVar12;
  undefined4 *puVar13;
  LabelInstr *pLVar14;
  BranchInstr *pBVar15;
  LabelInstr *pLVar16;
  JITTimeFunctionBody *this;
  RegOpnd *this_00;
  StackSym *pSVar17;
  ByteCodeUsesInstr *this_01;
  Instr *instr;
  Opnd *pOVar18;
  MultiBranchInstr *pMVar19;
  long lVar20;
  LabelInstr *pLVar21;
  char *pcVar22;
  ulong uVar23;
  uint uVar24;
  char *pcVar25;
  long lVar26;
  uint uVar27;
  Instr *instrTmp;
  LabelInstr *pLVar28;
  int iVar29;
  long lVar30;
  long *plVar31;
  bool *peepedRef_local;
  
  while( true ) {
    if (peepedRef != (bool *)0x0) {
      *peepedRef = false;
    }
    pLVar21 = branchInstr->m_branchTarget;
    OVar3 = (branchInstr->super_Instr).m_opcode;
    if (OVar3 < ADD) {
      bVar9 = OVar3 == MultiBr || OVar3 == Br;
    }
    else {
      bVar9 = LowererMD::IsUnconditionalBranch(&branchInstr->super_Instr);
    }
    if (bVar9 != false) {
      RemoveDeadBlock((branchInstr->super_Instr).m_next,(bool *)0x0);
    }
    pLVar12 = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel(&branchInstr->super_Instr);
    if ((pLVar12 != (LabelInstr *)0x0) &&
       ((IVar1 = (pLVar12->super_Instr).m_kind, pLVar14 = pLVar12, IVar1 == InstrKindProfiledLabel
        || (IVar1 == InstrKindLabel)))) goto joined_r0x0062414e;
    OVar3 = (branchInstr->super_Instr).m_opcode;
    if (OVar3 < ADD) {
      bVar9 = OVar3 == MultiBr || OVar3 == Br;
    }
    else {
      bVar9 = LowererMD::IsUnconditionalBranch(&branchInstr->super_Instr);
    }
    if (bVar9 != false) break;
    if (pLVar12 == (LabelInstr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                         ,0x251,"(instrNext)","instrNext");
      if (!bVar9) goto LAB_00624ab2;
      *puVar13 = 0;
    }
    if ((pLVar12->super_Instr).m_kind != InstrKindBranch) break;
    OVar3 = (pLVar12->super_Instr).m_opcode;
    if (OVar3 < ADD) {
      bVar9 = OVar3 == MultiBr || OVar3 == Br;
    }
    else {
      bVar9 = LowererMD::IsUnconditionalBranch((Instr *)pLVar12);
    }
    if (bVar9 == false) break;
    if ((pLVar12->super_Instr).m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar9) goto LAB_00624ab2;
      *puVar13 = 0;
    }
    pLVar14 = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel((Instr *)pLVar12);
    if (pLVar21 != pLVar14) break;
    if ((pLVar12->super_Instr).m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar9) goto LAB_00624ab2;
      *puVar13 = 0;
    }
    pAVar5 = (pLVar12->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
             allocator;
    cVar2 = *(char *)((long)&(pLVar12->labelRefs).
                             super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                             super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                             super_SListNodeBase<Memory::ArenaAllocator>.next + 1);
    if (pAVar5 == (Type)0x0) {
      if (cVar2 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        uVar27 = 0x20e;
        pcVar25 = "(m_isMultiBranch)";
        pcVar22 = "m_isMultiBranch";
        goto LAB_006240c8;
      }
    }
    else if (cVar2 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      uVar27 = 0x209;
      pcVar25 = "(!m_isMultiBranch)";
      pcVar22 = "!m_isMultiBranch";
LAB_006240c8:
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,uVar27,pcVar25,pcVar22);
      if (!bVar9) goto LAB_00624ab2;
      *puVar13 = 0;
    }
    if (pAVar5 == (Type)0x0) break;
    pBVar15 = IR::Instr::AsBranchInstr((Instr *)pLVar12);
    if ((branchInstr->super_Instr).m_opcode < ADD) {
      IR::BranchInstr::Invert(branchInstr);
    }
    else {
      LowererMD::InvertBranch(branchInstr);
    }
    pLVar21 = pBVar15->m_branchTarget;
    IR::BranchInstr::SetTarget(branchInstr,pLVar21);
    if (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
         (pLVar21->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
         super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
         super_SListNodeBase<Memory::ArenaAllocator>.next == &pLVar21->labelRefs) &&
       ((pLVar21->field_0x78 & 4) == 0)) {
      PeepUnreachableLabel(pLVar21,false,(bool *)0x0);
    }
    IR::Instr::Remove(&pBVar15->super_Instr);
  }
LAB_00624811:
  pLVar12 = branchInstr->m_branchTarget;
  if (pLVar12 == (LabelInstr *)0x0) {
    if (branchInstr->m_isMultiBranch == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      pcVar25 = "(m_isMultiBranch)";
      pcVar22 = "m_isMultiBranch";
      uVar27 = 0x20e;
      goto LAB_006248ad;
    }
  }
  else if (branchInstr->m_isMultiBranch != false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    pcVar25 = "(!m_isMultiBranch)";
    pcVar22 = "!m_isMultiBranch";
    uVar27 = 0x209;
LAB_006248ad:
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,uVar27,pcVar25,pcVar22);
    if (!bVar9) goto LAB_00624ab2;
    *puVar13 = 0;
  }
  if (pLVar12 == (LabelInstr *)0x0) {
    pMVar19 = IR::BranchInstr::AsMultiBrInstr(branchInstr);
    plVar7 = (long *)pMVar19->m_branchTargets;
    if (plVar7 != (long *)0x0) {
      KVar4 = pMVar19->m_kind;
      if ((KVar4 == IntJumpTable) || (KVar4 == SingleCharStrJumpTable)) {
        plVar31 = plVar7 + 1;
        lVar30 = pMVar19->m_baseCaseValue;
        if (lVar30 <= pMVar19->m_lastCaseValue) {
          lVar20 = *plVar7;
          do {
            lVar26 = lVar20 + pMVar19->m_baseCaseValue * -8;
            pLVar21 = RetargetBrToBr(branchInstr,*(LabelInstr **)(lVar26 + lVar30 * 8));
            *(LabelInstr **)(lVar26 + lVar30 * 8) = pLVar21;
            lVar30 = lVar30 + 1;
          } while (lVar30 <= pMVar19->m_lastCaseValue);
        }
      }
      else if (KVar4 == StrDictionary) {
        plVar31 = plVar7 + 7;
        if (*(int *)((long)plVar7 + 0x1c) != 0) {
          uVar23 = 0;
          do {
            iVar29 = *(int *)(*plVar7 + uVar23 * 4);
            while (iVar29 != -1) {
              lVar30 = plVar7[1];
              lVar20 = (long)iVar29;
              iVar29 = *(int *)(lVar30 + 8 + lVar20 * 0x18);
              pLVar21 = RetargetBrToBr(branchInstr,*(LabelInstr **)(lVar30 + lVar20 * 0x18));
              *(LabelInstr **)(lVar30 + lVar20 * 0x18) = pLVar21;
            }
            uVar23 = uVar23 + 1;
          } while (uVar23 < *(uint *)((long)plVar7 + 0x1c));
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x435,"(false)","false");
        if (!bVar9) {
LAB_00624ab2:
          pcVar8 = (code *)invalidInstructionException();
          (*pcVar8)();
        }
        *puVar13 = 0;
        plVar31 = (long *)0x0;
      }
      pLVar21 = RetargetBrToBr(branchInstr,(LabelInstr *)*plVar31);
      *plVar31 = (long)pLVar21;
    }
  }
  else {
    RetargetBrToBr(branchInstr,pLVar21);
  }
  return (branchInstr->super_Instr).m_next;
joined_r0x0062414e:
  for (; (pLVar14 != pLVar21 &&
         ((IVar1 = (pLVar14->super_Instr).m_kind, IVar1 == InstrKindProfiledLabel ||
          (IVar1 == InstrKindLabel))));
      pLVar14 = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel(&pLVar14->super_Instr)) {
  }
  IVar1 = (pLVar14->super_Instr).m_kind;
  pLVar28 = pLVar12;
  if ((IVar1 == InstrKindProfiledLabel) || (pLVar16 = pLVar14, IVar1 == InstrKindLabel)) {
    if (pLVar12 == pLVar14) {
      pLVar16 = (LabelInstr *)0x0;
    }
    else {
      IVar1 = (pLVar12->super_Instr).m_kind;
      if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
        if (!bVar9) goto LAB_00624ab2;
        *puVar13 = 0;
      }
      bVar11 = pLVar12->field_0x78;
      IVar1 = (pLVar14->super_Instr).m_kind;
      if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
        if (!bVar9) goto LAB_00624ab2;
        *puVar13 = 0;
      }
      if (((bVar11 ^ pLVar14->field_0x78) & 2) != 0) {
        IVar1 = (pLVar12->super_Instr).m_kind;
        if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
          if (!bVar9) goto LAB_00624ab2;
          *puVar13 = 0;
        }
        pLVar12->field_0x78 = pLVar12->field_0x78 | 0x20;
      }
      IVar1 = (pLVar14->super_Instr).m_kind;
      if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
        if (!bVar9) goto LAB_00624ab2;
        *puVar13 = 0;
      }
      bVar11 = pLVar14->field_0x78;
      IVar1 = (pLVar12->super_Instr).m_kind;
      if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
        if (!bVar9) goto LAB_00624ab2;
        *puVar13 = 0;
      }
      pLVar12->field_0x78 = pLVar12->field_0x78 & 0xfd | bVar11 & 2;
      pLVar16 = pLVar12;
      pLVar28 = pLVar14;
    }
  }
  if (pLVar21 == pLVar28) {
    if ((branchInstr->super_Instr).m_opcode < ADD) {
      bVar9 = IR::Instr::HasAnyImplicitCalls(&branchInstr->super_Instr);
      if (bVar9) {
        this = JITTimeWorkItem::GetJITFunctionBody(((branchInstr->super_Instr).m_func)->m_workItem);
        bVar9 = JITTimeFunctionBody::IsAsmJsMode(this);
        if (bVar9) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                             ,0x1ed,"(!branchInstr->m_func->GetJITFunctionBody()->IsAsmJsMode())",
                             "!branchInstr->m_func->GetJITFunctionBody()->IsAsmJsMode()");
          if (!bVar9) goto LAB_00624ab2;
          *puVar13 = 0;
        }
        OVar3 = (branchInstr->super_Instr).m_opcode;
        opcode = DeadBrEqual;
        uVar24 = OVar3 - 0x18e;
        if (uVar24 < 0xe) {
          if ((0x3c0fU >> (uVar24 & 0x1f) & 1) == 0) {
            if ((0xc0U >> (uVar24 & 0x1f) & 1) == 0) {
              if ((0x300U >> (uVar24 & 0x1f) & 1) == 0) goto LAB_00624497;
LAB_006244ca:
              opcode = DeadBrSrEqual;
            }
          }
          else {
LAB_00624598:
            opcode = DeadBrRelational;
          }
        }
        else {
LAB_00624497:
          uVar24 = (uint)OVar3;
          if (OVar3 < 0x16) {
            if ((0xf0000U >> (OVar3 & 0x1f) & 1) != 0) goto LAB_00624598;
            if ((0x3000U >> (uVar24 & 0x1f) & 1) != 0) goto LAB_0062459c;
            if ((0x300000U >> (uVar24 & 0x1f) & 1) != 0) goto LAB_006244ca;
          }
          if (uVar24 - 0x102 < 2) {
            opcode = DeadBrOnHasProperty;
          }
          else {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar13 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                               ,0x216,"((0))","UNREACHED");
            if (!bVar9) goto LAB_00624ab2;
            *puVar13 = 0;
            opcode = Nop;
          }
        }
LAB_0062459c:
        instr = IR::Instr::New(opcode,(branchInstr->super_Instr).m_func);
        pOVar18 = (branchInstr->super_Instr).m_src1;
        if (instr->m_src1 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
          if (!bVar9) goto LAB_00624ab2;
          *puVar13 = 0;
        }
        pFVar6 = instr->m_func;
        if (pOVar18->isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar9) goto LAB_00624ab2;
          *puVar13 = 0;
        }
        bVar11 = pOVar18->field_0xb;
        if ((bVar11 & 2) != 0) {
          pOVar18 = IR::Opnd::Copy(pOVar18,pFVar6);
          bVar11 = pOVar18->field_0xb;
        }
        pOVar18->field_0xb = bVar11 | 2;
        instr->m_src1 = pOVar18;
        pOVar18 = (branchInstr->super_Instr).m_src2;
        if (instr->m_src2 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
          if (!bVar9) goto LAB_00624ab2;
          *puVar13 = 0;
        }
        pFVar6 = instr->m_func;
        if (pOVar18->isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar9) goto LAB_00624ab2;
          *puVar13 = 0;
        }
        bVar11 = pOVar18->field_0xb;
        if ((bVar11 & 2) != 0) {
          pOVar18 = IR::Opnd::Copy(pOVar18,pFVar6);
          bVar11 = pOVar18->field_0xb;
        }
        pOVar18->field_0xb = bVar11 | 2;
        instr->m_src2 = pOVar18;
        IR::Instr::InsertBefore(&branchInstr->super_Instr,instr);
        IR::Instr::SetByteCodeOffset(instr,&branchInstr->super_Instr);
      }
      else {
        pOVar18 = (branchInstr->super_Instr).m_src1;
        if ((pOVar18 != (Opnd *)0x0) && ((branchInstr->super_Instr).m_src2 == (Opnd *)0x0)) {
          OVar10 = IR::Opnd::GetKind(pOVar18);
          if (OVar10 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar13 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                               ,0x222,"(branchInstr->GetSrc1()->IsRegOpnd())",
                               "branchInstr->GetSrc1()->IsRegOpnd()");
            if (!bVar9) goto LAB_00624ab2;
            *puVar13 = 0;
          }
          this_00 = IR::Opnd::AsRegOpnd((branchInstr->super_Instr).m_src1);
          pSVar17 = IR::Opnd::GetStackSym(&this_00->super_Opnd);
          if (((pSVar17->field_0x19 & 0x20) != 0) && (((this_00->super_Opnd).field_0xb & 8) == 0)) {
            this_01 = IR::ByteCodeUsesInstr::New(&branchInstr->super_Instr);
            IR::ByteCodeUsesInstr::Set(this_01,&this_00->super_Opnd);
            IR::Instr::InsertBefore(&branchInstr->super_Instr,&this_01->super_Instr);
          }
        }
      }
    }
    if (peepedRef != (bool *)0x0) {
      *peepedRef = true;
    }
    IR::Instr::Remove(&branchInstr->super_Instr);
    pLVar12 = pLVar21;
    if (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
         (pLVar21->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
         super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
         super_SListNodeBase<Memory::ArenaAllocator>.next == &pLVar21->labelRefs) &&
       ((pLVar21->field_0x78 & 4) == 0)) {
      pLVar12 = (LabelInstr *)PeepUnreachableLabel(pLVar21,false,(bool *)0x0);
    }
    pBVar15 = (BranchInstr *)IR::Instr::GetPrevRealInstrOrLabel(&pLVar12->super_Instr);
    if ((pBVar15->super_Instr).m_kind == InstrKindBranch) {
      pLVar12 = (LabelInstr *)PeepBranch(pBVar15,(bool *)0x0);
    }
    else if (pLVar16 != (LabelInstr *)0x0) {
      pLVar12 = pLVar16;
    }
  }
  if (pLVar21 == pLVar28) {
    return &pLVar12->super_Instr;
  }
  goto LAB_00624811;
}

Assistant:

IR::Instr *
Peeps::PeepBranch(IR::BranchInstr *branchInstr, bool *const peepedRef)
{
    if(peepedRef)
    {
        *peepedRef = false;
    }

    IR::LabelInstr *targetInstr = branchInstr->GetTarget();
    IR::Instr *instrNext;

    if (branchInstr->IsUnconditional())
    {
        // Cleanup unreachable code after unconditional branch
        instrNext = RemoveDeadBlock(branchInstr->m_next);
    }

    instrNext = branchInstr->GetNextRealInstrOrLabel();

    if (instrNext != NULL && instrNext->IsLabelInstr())
    {
        //
        // Remove branch-to-next
        //
        IR::Instr * instrSkip = instrNext;
        while (instrSkip != targetInstr && instrSkip->IsLabelInstr())
        {
            // Skip adjacent labels
            instrSkip = instrSkip->GetNextRealInstrOrLabel();
        }
        if (instrSkip->IsLabelInstr())
        {
            if (instrNext == instrSkip)
            {
                instrSkip = nullptr;
            }
            else
            {
                IR::Instr *instrTmp = instrSkip;

                // Ignore assertion error for cases where we insert an "airlock" helper block
                // for a Branch instruction's helper path that:
                //  1) ends up being empty
                //  2) comes after a helper block from another instruction
                //  3) is followed by a non-helper block
                //
                // Propagating the "isOpHelper" flag can potentially make this block a non-helper,
                // and that makes this block only reachable through helper blocks, thus failing the assert 
#if DBG
                if (instrNext->AsLabelInstr()->isOpHelper != instrSkip->AsLabelInstr()->isOpHelper)
                {
                    instrNext->AsLabelInstr()->m_noHelperAssert = true;
                }
#endif
                instrNext->AsLabelInstr()->isOpHelper = instrSkip->AsLabelInstr()->isOpHelper;
                instrSkip = instrNext;
                instrNext = instrTmp;
            }
        }
        if (targetInstr == instrNext)
        {
            if (!branchInstr->IsLowered())
            {
                if (branchInstr->HasAnyImplicitCalls())
                {
                    Assert(!branchInstr->m_func->GetJITFunctionBody()->IsAsmJsMode());
                    // if (x > y) might trigger a call to valueof() or something for x and y.
                    // We can't just delete them.
                    Js::OpCode newOpcode;
                    switch(branchInstr->m_opcode)
                    {
                    case Js::OpCode::BrEq_A:
                    case Js::OpCode::BrNeq_A:
                    case Js::OpCode::BrNotEq_A:
                    case Js::OpCode::BrNotNeq_A:
                        newOpcode = Js::OpCode::DeadBrEqual;
                        break;

                    case Js::OpCode::BrSrEq_A:
                    case Js::OpCode::BrSrNeq_A:
                    case Js::OpCode::BrSrNotEq_A:
                    case Js::OpCode::BrSrNotNeq_A:
                        newOpcode = Js::OpCode::DeadBrSrEqual;
                        break;

                    case Js::OpCode::BrGe_A:
                    case Js::OpCode::BrGt_A:
                    case Js::OpCode::BrLe_A:
                    case Js::OpCode::BrLt_A:
                    case Js::OpCode::BrNotGe_A:
                    case Js::OpCode::BrNotGt_A:
                    case Js::OpCode::BrNotLe_A:
                    case Js::OpCode::BrNotLt_A:
                    case Js::OpCode::BrUnGe_A:
                    case Js::OpCode::BrUnGt_A:
                    case Js::OpCode::BrUnLe_A:
                    case Js::OpCode::BrUnLt_A:
                        newOpcode = Js::OpCode::DeadBrRelational;
                        break;

                    case Js::OpCode::BrOnHasProperty:
                    case Js::OpCode::BrOnNoProperty:
                        newOpcode = Js::OpCode::DeadBrOnHasProperty;
                        break;

                    default:
                        Assert(UNREACHED);
                        newOpcode = Js::OpCode::Nop;
                    }
                    IR::Instr *newInstr = IR::Instr::New(newOpcode, branchInstr->m_func);
                    newInstr->SetSrc1(branchInstr->GetSrc1());
                    newInstr->SetSrc2(branchInstr->GetSrc2());
                    branchInstr->InsertBefore(newInstr);
                    newInstr->SetByteCodeOffset(branchInstr);
                }
                else if (branchInstr->GetSrc1() && !branchInstr->GetSrc2())
                {
                    // We only have cases with one src
                    Assert(branchInstr->GetSrc1()->IsRegOpnd());

                    IR::RegOpnd *regSrc = branchInstr->GetSrc1()->AsRegOpnd();
                    StackSym *symSrc = regSrc->GetStackSym();

                    if (symSrc->HasByteCodeRegSlot() && !regSrc->GetIsJITOptimizedReg())
                    {
                        // No side-effects to worry about, but need to insert bytecodeUse.
                        IR::ByteCodeUsesInstr *byteCodeUsesInstr = IR::ByteCodeUsesInstr::New(branchInstr);
                        byteCodeUsesInstr->Set(regSrc);
                        branchInstr->InsertBefore(byteCodeUsesInstr);
                    }
                }
            }
            // Note: if branch is conditional, we have a dead test/cmp left behind...
            if(peepedRef)
            {
                *peepedRef = true;
            }
            branchInstr->Remove();
            if (targetInstr->IsUnreferenced())
            {
                // We may have exposed an unreachable label by deleting the branch
                instrNext = Peeps::PeepUnreachableLabel(targetInstr, false);
            }
            else
            {
                instrNext = targetInstr;
            }
            IR::Instr *instrPrev = instrNext->GetPrevRealInstrOrLabel();
            if (instrPrev->IsBranchInstr())
            {
                // The branch removal could have exposed a branch to next opportunity.
                return Peeps::PeepBranch(instrPrev->AsBranchInstr());
            }
            if (instrSkip)
            {
                return instrSkip;
            }
            else
            {
                return instrNext;
            }
        }
    }
    else if (branchInstr->IsConditional())
    {
        AnalysisAssert(instrNext);
        if (instrNext->IsBranchInstr()
            && instrNext->AsBranchInstr()->IsUnconditional()
            && targetInstr == instrNext->AsBranchInstr()->GetNextRealInstrOrLabel()
            && !instrNext->AsBranchInstr()->IsMultiBranch())
        {
            //
            // Invert condBranch/uncondBranch/label:
            //
            //      JCC L1                   JinvCC L3
            //      JMP L3       =>
            //      L1:
            IR::BranchInstr *uncondBranch = instrNext->AsBranchInstr();

            if (branchInstr->IsLowered())
            {
                LowererMD::InvertBranch(branchInstr);
            }
            else
            {
                branchInstr->Invert();
            }

            targetInstr = uncondBranch->GetTarget();
            branchInstr->SetTarget(targetInstr);
            if (targetInstr->IsUnreferenced())
            {
                Peeps::PeepUnreachableLabel(targetInstr, false);
            }

            uncondBranch->Remove();

            return PeepBranch(branchInstr, peepedRef);
        }
    }

    if(branchInstr->IsMultiBranch())
    {
        IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsMultiBrInstr();

        multiBranchInstr->UpdateMultiBrLabels([=](IR::LabelInstr * targetInstr) -> IR::LabelInstr *
        {
            IR::LabelInstr * labelInstr = RetargetBrToBr(branchInstr, targetInstr);
            return labelInstr;
        });
    }
    else
    {
        RetargetBrToBr(branchInstr, targetInstr);
    }

    return branchInstr->m_next;
}